

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_BlindUnmatchInOutTest_Test::TestBody
          (ConfidentialTransaction_BlindUnmatchInOutTest_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  AssertHelper local_3f0;
  Message local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_388 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  Amount local_360;
  ConfidentialValue local_350;
  BlindFactor local_328;
  BlindFactor local_308;
  ConfidentialAssetId local_2e8;
  undefined1 local_2c0 [8];
  BlindParameter param;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> blind_list;
  Privkey privkey2;
  Pubkey pubkey2;
  Privkey privkey1;
  Pubkey pubkey1;
  undefined1 local_1a0 [8];
  string privkey2_hex;
  undefined1 local_178 [8];
  string pubkey2_hex;
  undefined1 local_150 [8];
  string privkey1_hex;
  undefined1 local_128 [8];
  string pubkey1_hex;
  undefined1 local_100 [8];
  string inputassetblinder;
  undefined1 local_d8 [8];
  string inputasset;
  undefined1 local_b0 [8];
  string inputblinder;
  double inputamount;
  ConfidentialTransaction tx;
  allocator local_31;
  undefined1 local_30 [8];
  string tx_hex;
  ConfidentialTransaction_BlindUnmatchInOutTest_Test *this_local;
  
  tx_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "020000000001e6162f9bbac022e67327e717a3885b316a54e50c34ba266b58f1999854c596810100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000138800017a914a3949e9a8b0b813db67c8fc5ad14194a297979cd870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000027100017a9145227b0820cf08f489873888672a5d97face863b2870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&inputamount,(string *)local_30);
  inputblinder.field_2._8_8_ = 0x3f689374bc6a7efa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_b0,"55bf185ddc2d1c747da2a82b8c9954179edec0af886daaf98d8a7b862e78bcee",
             (allocator *)(inputasset.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(inputasset.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)(inputassetblinder.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(inputassetblinder.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_100,"95e6e0912047f088394be103f3a1761adcbd92466abfe41f0964a3aa2fc201e5",
             (allocator *)(pubkey1_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(pubkey1_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_128,
             "0213c4451645063e1edd5fe76e5194864c2246d4c4e6c8df5a305224046e1ea2c4",
             (allocator *)(privkey1_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(privkey1_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_150,"66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83",
             (allocator *)(pubkey2_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(pubkey2_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_178,
             "0222722d38de0463756bdfc460de0547a89e17159150d07b6cf69029ba33adf967",
             (allocator *)(privkey2_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(privkey2_hex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1a0,"715b3d80726388b7daff92388f82c8ddf5ee7248900552a0bcd16d7d46b439c0",
             (allocator *)
             ((long)&pubkey1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)&privkey1.is_compressed_,(string *)local_128);
  cfd::core::Privkey::Privkey
            ((Privkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_150,kMainnet,true);
  cfd::core::Pubkey::Pubkey((Pubkey *)&privkey2.is_compressed_,(string *)local_178);
  cfd::core::Privkey::Privkey
            ((Privkey *)
             &blind_list.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1a0,kMainnet,true);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             &param.value.version_);
  cfd::core::UnblindParameter::UnblindParameter((UnblindParameter *)local_2c0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2e8,(string *)local_d8);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)local_2c0,&local_2e8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_2e8);
  cfd::core::BlindFactor::BlindFactor(&local_308,(string *)local_100);
  cfd::core::BlindFactor::operator=((BlindFactor *)&param.asset.version_,&local_308);
  cfd::core::BlindFactor::~BlindFactor(&local_308);
  cfd::core::BlindFactor::BlindFactor(&local_328,(string *)local_b0);
  cfd::core::BlindFactor::operator=
            ((BlindFactor *)
             ((long)&param.abf.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),&local_328);
  cfd::core::BlindFactor::~BlindFactor(&local_328);
  AVar2 = cfd::core::Amount::CreateByCoinAmount((double)inputblinder.field_2._8_8_);
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar2.amount_;
  local_360.ignore_check_ = AVar2.ignore_check_;
  local_360.amount_ =
       (int64_t)pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::ConfidentialValue::ConfidentialValue(&local_350,&local_360);
  cfd::core::ConfidentialValue::operator=
            ((ConfidentialValue *)
             ((long)&param.vbf.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),&local_350);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_350);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::push_back
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             &param.value.version_,(value_type *)local_2c0);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_388);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_388,
             (value_type *)&privkey1.is_compressed_);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_388,
             (value_type *)&privkey2.is_compressed_);
  cfd::core::Pubkey::Pubkey((Pubkey *)&except);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_388,
             (value_type *)&except);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&except);
  cfd::core::ConfidentialTransaction::BlindTxOut
            ((ConfidentialTransaction *)&inputamount,
             (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             &param.value.version_,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_388,1,0,0x34,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3e0,"\"\"","\"Error Test Fail.\"","","Error Test Fail.");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x466,message);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  gtest_ar_1.message_.ptr_._4_4_ = 0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_388);
  cfd::core::UnblindParameter::~UnblindParameter((UnblindParameter *)local_2c0);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             &param.value.version_);
  cfd::core::Privkey::~Privkey
            ((Privkey *)
             &blind_list.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&privkey2.is_compressed_);
  cfd::core::Privkey::~Privkey
            ((Privkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&privkey1.is_compressed_);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_b0);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&inputamount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ConfidentialTransaction, BlindUnmatchInOutTest) {
  std::string tx_hex = "020000000001e6162f9bbac022e67327e717a3885b316a54e50c34ba266b58f1999854c596810100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000138800017a914a3949e9a8b0b813db67c8fc5ad14194a297979cd870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000027100017a9145227b0820cf08f489873888672a5d97face863b2870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000";
  ConfidentialTransaction tx(tx_hex);
  double inputamount = 0.003;
  std::string inputblinder =
      "55bf185ddc2d1c747da2a82b8c9954179edec0af886daaf98d8a7b862e78bcee";
  std::string inputasset =
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";
  std::string inputassetblinder =
      "95e6e0912047f088394be103f3a1761adcbd92466abfe41f0964a3aa2fc201e5";
  std::string pubkey1_hex =
      "0213c4451645063e1edd5fe76e5194864c2246d4c4e6c8df5a305224046e1ea2c4";
  std::string privkey1_hex =
      "66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83";
  std::string pubkey2_hex =
      "0222722d38de0463756bdfc460de0547a89e17159150d07b6cf69029ba33adf967";
  std::string privkey2_hex =
      "715b3d80726388b7daff92388f82c8ddf5ee7248900552a0bcd16d7d46b439c0";
  Pubkey pubkey1(pubkey1_hex);
  Privkey privkey1(privkey1_hex);
  Pubkey pubkey2(pubkey2_hex);
  Privkey privkey2(privkey2_hex);

  std::vector<BlindParameter> blind_list;
  BlindParameter param;
  param.asset = ConfidentialAssetId(inputasset);
  param.abf = BlindFactor(inputassetblinder);
  param.vbf = BlindFactor(inputblinder);
  param.value = ConfidentialValue(Amount::CreateByCoinAmount(inputamount));
  blind_list.push_back(param);
  std::vector<Pubkey> pubkeys;
  pubkeys.push_back(pubkey1);
  pubkeys.push_back(pubkey2);
  pubkeys.push_back(Pubkey());

  try {
    tx.BlindTxOut(blind_list, pubkeys);
  } catch (const CfdException& except) {
    EXPECT_STREQ("unmatch input/output amount.", except.what());
    return;
  }
  EXPECT_STREQ("", "Error Test Fail.");
}